

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.h
# Opt level: O0

void __thiscall
libDAI::RegionGraph::setFactors
          (RegionGraph *this,
          map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
          *facs,bool backup)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_> *in_RDI;
  const_iterator fac;
  VarSet ns;
  map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
  *in_stack_ffffffffffffff88;
  VarSet *in_stack_ffffffffffffff90;
  bool in_stack_ffffffffffffffb7;
  _Self in_stack_ffffffffffffffb8;
  _Self in_stack_ffffffffffffffc0;
  VarSet *in_stack_ffffffffffffffc8;
  VarSet *in_stack_ffffffffffffffd0;
  VarSet *in_stack_ffffffffffffffd8;
  RegionGraph *in_stack_ffffffffffffffe0;
  
  FactorGraph::setFactors
            ((FactorGraph *)in_stack_ffffffffffffffc0._M_node,
             (map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
              *)in_stack_ffffffffffffffb8._M_node,in_stack_ffffffffffffffb7);
  VarSet::VarSet(in_stack_ffffffffffffff90);
  std::
  map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
  ::begin(in_stack_ffffffffffffff88);
  while( true ) {
    std::
    map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
    ::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffc0,(_Self *)&stack0xffffffffffffffb8);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>
                           *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff90 = TFactor<double>::vars(&ppVar2->second);
    VarSet::operator|=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>::
    operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  }
  RecomputeORs(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  VarSet::~VarSet((VarSet *)0xb4fdcc);
  return;
}

Assistant:

virtual void setFactors( const std::map<size_t, Factor> & facs, bool backup = false ) {
                _fg.setFactors( facs, backup );
                VarSet ns;
                for( std::map<size_t, Factor>::const_iterator fac = facs.begin(); fac != facs.end(); fac++ )
                    ns |= fac->second.vars();
                RecomputeORs( ns ); 
            }